

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InvocationCountShader::shadePrimitives
          (InvocationCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  int iVar1;
  PrimitivePacket *pPVar2;
  VertexPacket *pVVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Vec4 position1;
  Vec4 position0;
  Vec4 position2;
  float local_dc;
  Vec4 local_d8;
  Vec4 local_c8;
  uint local_ac;
  float local_a8;
  uint local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  PrimitivePacket *local_88;
  ulong local_80;
  ulong local_78;
  InvocationCountShader *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vec4 local_58;
  anon_union_16_3_1194ccdc_for_v local_48;
  
  if (0 < numPackets) {
    local_dc = 1.0;
    if (((uint)(invocationID - (invocationID >> 0x1f)) >> 1 & 1) != 0) {
      local_dc = 0.0;
    }
    local_a0 = (float)invocationID;
    local_a8 = (float)(invocationID % 2);
    local_a4 = invocationID + 3;
    local_9c = (float)(int)local_a4;
    local_ac = local_a4 & 0x80000001;
    local_78 = (ulong)(uint)numPackets;
    uVar5 = 0;
    local_88 = packets;
    local_70 = this;
    do {
      fVar7 = (local_a0 / (float)*(int *)&(local_70->super_ShaderProgram).field_0x154) * 5.5;
      pPVar2 = packets + uVar5;
      pVVar3 = packets[uVar5].vertices[0];
      if (local_70->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
        local_80 = uVar5;
        fVar8 = cosf(fVar7);
        fVar7 = sinf(fVar7);
        uVar4 = local_a4;
        fVar8 = (pVVar3->position).m_data[0] + fVar8 * 0.6;
        fVar7 = (pVVar3->position).m_data[1] + fVar7 * 0.6;
        fVar9 = (pVVar3->position).m_data[2] + 0.0;
        fVar12 = (pVVar3->position).m_data[3] + 0.0;
        local_c8.m_data[1] = local_dc;
        local_c8.m_data[0] = local_a8;
        local_c8.m_data[2] = 1.0;
        local_c8.m_data[3] = 1.0;
        if (1 < (int)local_a4) {
          iVar6 = 0;
          do {
            fVar10 = (((float)iVar6 + 1.0) / local_9c) * 3.141;
            local_98 = cosf(fVar10);
            fVar11 = sinf(fVar10);
            local_d8.m_data[1] = fVar11 * 0.1 + fVar7;
            local_d8.m_data[0] = local_98 * 0.1 + fVar8;
            local_d8.m_data[3] = fVar12 + 0.0;
            local_d8.m_data[2] = fVar9 + 0.0;
            rr::GeometryEmitter::EmitVertex
                      (output,&local_d8,0.0,(GenericVec4 *)&local_c8,pPVar2->primitiveIDIn);
            local_98 = cosf(fVar10);
            fVar10 = sinf(fVar10);
            local_d8.m_data[1] = fVar10 * -0.1 + fVar7;
            local_d8.m_data[0] = local_98 * 0.1 + fVar8;
            local_d8.m_data[3] = fVar12 + 0.0;
            local_d8.m_data[2] = fVar9 + 0.0;
            rr::GeometryEmitter::EmitVertex
                      (output,&local_d8,0.0,(GenericVec4 *)&local_c8,pPVar2->primitiveIDIn);
            iVar1 = iVar6 + 3;
            iVar6 = iVar6 + 2;
          } while (iVar1 < (int)uVar4);
        }
        if (local_ac == 1) {
          local_d8.m_data[1] = fVar7 + 0.0;
          local_d8.m_data[0] = fVar8 + -0.1;
          local_d8.m_data[3] = fVar12 + 0.0;
          local_d8.m_data[2] = fVar9 + 0.0;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_d8,0.0,(GenericVec4 *)&local_c8,pPVar2->primitiveIDIn);
        }
        rr::GeometryEmitter::EndPrimitive(output);
        uVar5 = local_80;
        packets = local_88;
      }
      else if (local_70->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
        fVar8 = cosf(fVar7);
        fVar9 = sinf(fVar7);
        local_c8.m_data[1] = (pVVar3->position).m_data[1] + fVar9 * 0.5;
        local_c8.m_data[0] = (pVVar3->position).m_data[0] + fVar8 * 0.5;
        local_c8.m_data[3] = (pVVar3->position).m_data[3] + 0.0;
        local_c8.m_data[2] = (pVVar3->position).m_data[2] + 0.0;
        local_98 = fVar7 + 0.1;
        fVar8 = cosf(local_98);
        fVar9 = sinf(local_98);
        local_d8.m_data[1] = (pVVar3->position).m_data[1] + fVar9 * 0.6;
        local_d8.m_data[0] = (pVVar3->position).m_data[0] + fVar8 * 0.6;
        local_d8.m_data[3] = (pVVar3->position).m_data[3] + 0.0;
        local_d8.m_data[2] = (pVVar3->position).m_data[2] + 0.0;
        fVar8 = cosf(fVar7 + -0.1);
        fVar7 = sinf(fVar7 + -0.1);
        local_58.m_data[1] = (pVVar3->position).m_data[1] + fVar7 * 0.6;
        local_58.m_data[0] = (pVVar3->position).m_data[0] + fVar8 * 0.6;
        local_58.m_data[3] = (pVVar3->position).m_data[3] + 0.0;
        local_58.m_data[2] = (pVVar3->position).m_data[2] + 0.0;
        pVVar3 = pPVar2->vertices[0];
        fVar7 = pVVar3->outputs[0].v.fData[0];
        fVar8 = pVVar3->outputs[0].v.fData[1];
        fVar9 = pVVar3->outputs[0].v.fData[2];
        fVar12 = pVVar3->outputs[0].v.fData[3];
        local_48.fData[0] = fVar7 * 1.0;
        local_48.fData[1] = fVar8 * 1.0;
        local_48.fData[2] = fVar9 * 0.0;
        local_48.fData[3] = fVar12 * 1.0;
        fStack_64 = fVar8 * 0.0;
        local_68 = fVar7 * 1.0;
        fStack_5c = fVar12 * 1.0;
        fStack_60 = fVar9 * 0.0;
        rr::GeometryEmitter::EmitVertex
                  (output,&local_c8,0.0,(GenericVec4 *)&local_48,pPVar2->primitiveIDIn);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_d8,0.0,(GenericVec4 *)&local_68,pPVar2->primitiveIDIn);
        rr::GeometryEmitter::EmitVertex
                  (output,&local_58,0.0,(GenericVec4 *)&local_68,pPVar2->primitiveIDIn);
        rr::GeometryEmitter::EndPrimitive(output);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_78);
  }
  return;
}

Assistant:

void InvocationCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const float				l_angle		= float(invocationID) / float(m_numInvocations) * 5.5f;
		const float				l_radius	= 0.6f;

		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];

		if (m_testCase == CASE_FIXED_OUTPUT_COUNTS)
		{
			const tcu::Vec4			position0	= vertex->position + tcu::Vec4(deFloatCos(l_angle)      * (l_radius - 0.1f), deFloatSin(l_angle)      * (l_radius - 0.1f), 0.0f, 0.0f);
			const tcu::Vec4			position1	= vertex->position + tcu::Vec4(deFloatCos(l_angle+0.1f) * l_radius,          deFloatSin(l_angle+0.1f) * l_radius,          0.0f, 0.0f);
			const tcu::Vec4			position2	= vertex->position + tcu::Vec4(deFloatCos(l_angle-0.1f) * l_radius,          deFloatSin(l_angle-0.1f) * l_radius,          0.0f, 0.0f);

			rr::GenericVec4			tipColor;
			rr::GenericVec4			baseColor;

			tipColor  = tcu::Vec4(1.0, 1.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();
			baseColor = tcu::Vec4(1.0, 0.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();

			output.EmitVertex(position0, 0.0f, &tipColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position2, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EndPrimitive();
		}
		else if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
		{
			const tcu::Vec4 color			= tcu::Vec4(float(invocationID % 2), (((invocationID / 2) % 2) == 0) ? (1.0f) : (0.0f), 1.0f, 1.0f);
			const tcu::Vec4 basePosition	= vertex->position + tcu::Vec4(deFloatCos(l_angle) * l_radius, deFloatSin(l_angle) * l_radius, 0.0f, 0.0f);
			const int		numNgonVtx		= invocationID + 3;

			rr::GenericVec4	outColor;
			outColor = color;

			for (int ndx = 0; ndx + 1 < numNgonVtx; ndx += 2)
			{
				const float subAngle = (float(ndx) + 1.0f) / float(numNgonVtx) * 3.141f;

				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) *  0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) * -0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
			}

			if ((numNgonVtx % 2) == 1)
				output.EmitVertex(basePosition + tcu::Vec4(-0.1f, 0.0f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);

			output.EndPrimitive();
		}
	}
}